

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_STATUS JlGetStringFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,char **pString)

{
  JL_STATUS JVar1;
  JlDataObject *object;
  JlDataObject *local_10;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if (pString != (char **)0x0 && (KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0)
     ) {
    *pString = (char *)0x0;
    local_10 = (JlDataObject *)0x0;
    JVar1 = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&local_10);
    if (JVar1 == JL_STATUS_SUCCESS) {
      if (local_10 == (JlDataObject *)0x0) {
        JVar1 = JL_STATUS_INVALID_PARAMETER;
      }
      else {
        JVar1 = JL_STATUS_WRONG_TYPE;
        if (local_10->Type == JL_DATA_TYPE_STRING) {
          *pString = (local_10->field_2).String;
          JVar1 = JL_STATUS_SUCCESS;
        }
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlGetStringFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        char const**                pString
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pString )
    {
        *pString = NULL;

        JlDataObject* object = NULL;
        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            char const* stringPtr = NULL;
            jlStatus = JlGetObjectString( object, &stringPtr );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pString = stringPtr;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}